

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_9219d::PedestrianPlugIn::reset(PedestrianPlugIn *this)

{
  pointer ppPVar1;
  
  for (ppPVar1 = (this->crowd).
                 super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppPVar1 !=
      (this->crowd).
      super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppPVar1 = ppPVar1 + 1) {
    Pedestrian::reset((Pedestrian *)*ppPVar1);
  }
  OpenSteer::OpenSteerDemo::position2dCamera(OpenSteer::OpenSteerDemo::selectedVehicle);
  OpenSteer::OpenSteerDemo::camera.smoothNextMove = false;
  return;
}

Assistant:

void reset (void)
        {
            // reset each Pedestrian
            for (iterator i = crowd.begin(); i != crowd.end(); i++) (**i).reset ();

            // reset camera position
            OpenSteerDemo::position2dCamera (*OpenSteerDemo::selectedVehicle);

            // make camera jump immediately to new position
            OpenSteerDemo::camera.doNotSmoothNextMove ();
        }